

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)24>_> *
vkt::tessellation::makeCommandPool
          (Move<vk::Handle<(vk::HandleType)24>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,deUint32 queueFamilyIndex)

{
  undefined1 local_40 [8];
  VkCommandPoolCreateInfo info;
  deUint32 queueFamilyIndex_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_40._0_4_ = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  info.pNext._0_4_ = 2;
  info.pNext._4_4_ = queueFamilyIndex;
  info.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            (__return_storage_ptr__,vk,device,(VkCommandPoolCreateInfo *)local_40,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkCommandPool> makeCommandPool (const DeviceInterface& vk, const VkDevice device, const deUint32 queueFamilyIndex)
{
	const VkCommandPoolCreateInfo info =
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,			// VkStructureType			sType;
		DE_NULL,											// const void*				pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,	// VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,									// deUint32					queueFamilyIndex;
	};
	return createCommandPool(vk, device, &info);
}